

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall helics::apps::Player::Player(Player *this,int argc,char **argv)

{
  undefined4 in_ESI;
  undefined8 *in_RDI;
  char **in_stack_00000180;
  int in_stack_0000018c;
  App *in_stack_00000190;
  undefined1 in_stack_00000198 [16];
  Player *this_00;
  char *in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_fffffffffffffff0;
  
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  App::App(in_stack_00000190,(string_view)in_stack_00000198,in_stack_0000018c,in_stack_00000180);
  *in_RDI = &PTR__Player_0091aa78;
  CLI::std::vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>::vector
            ((vector<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_> *)
             0x178d17);
  CLI::std::vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>::
  vector((vector<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_> *)
         0x178d2d);
  CLI::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)0x178d43);
  CLI::std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x178d59);
  CLI::std::deque<helics::Publication,_std::allocator<helics::Publication>_>::deque
            ((deque<helics::Publication,_std::allocator<helics::Publication>_> *)0x178d6f);
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::deque
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x178d87);
  this_00 = (Player *)(in_RDI + 0x3b);
  CLI::std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   *)0x178d9f);
  CLI::std::
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::unordered_map((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                   *)0x178db5);
  *(undefined4 *)(in_RDI + 0x49) = 0;
  in_RDI[0x4a] = 0;
  in_RDI[0x4b] = 0;
  *(undefined4 *)(in_RDI + 0x4c) = 5;
  in_RDI[0x4d] = 0x3ff0000000000000;
  in_RDI[0x4e] = 0;
  processArgs((Player *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  initialSetup(this_00);
  return;
}

Assistant:

Player::Player(int argc, char* argv[]): App("player_${#}", argc, argv)
{
    processArgs();
    initialSetup();
}